

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void duckdb::ModeFunction<duckdb::ModeString>::
     Window<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::string_t,duckdb::string_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t rid)

{
  DataChunk *result_00;
  ulong *puVar1;
  ValidityMask *pVVar2;
  long lVar3;
  pointer pFVar4;
  unsigned_long *puVar5;
  ColumnDataScanState *state;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar6;
  pointer pVVar7;
  undefined8 uVar8;
  Vector *pVVar9;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *__x;
  ModeState<duckdb::string_t,_duckdb::ModeString> *pMVar10;
  ModeIncluded<duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>_> *pMVar11;
  Allocator *pAVar12;
  undefined8 *puVar13;
  reference pvVar14;
  const_reference pvVar15;
  const_iterator cVar16;
  reference pvVar17;
  TemplatedValidityData<unsigned_long> *pTVar18;
  DataChunk *pDVar19;
  ulong uVar20;
  FrameBounds *frame;
  pointer pFVar21;
  idx_t seek_idx;
  string_t sVar22;
  Updater updater;
  undefined1 local_70 [16];
  data_ptr_t local_60;
  Vector *local_58;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *local_50;
  UpdateWindowState<duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>,_duckdb::string_t>
  local_48;
  idx_t local_38;
  
  pDVar19 = (DataChunk *)l_state;
  ModeState<duckdb::string_t,_duckdb::ModeString>::InitializePage
            ((ModeState<duckdb::string_t,_duckdb::ModeString> *)l_state,partition);
  pVVar2 = partition->filter_mask;
  local_60 = result->data;
  local_58 = result;
  FlatVector::VerifyFlatVector(result);
  if (*(long *)l_state == *(long *)(l_state + 8)) {
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,1);
  }
  local_70._0_8_ = pVVar2;
  local_70._8_8_ = l_state;
  if (*(long *)(l_state + 0x18) == 0) {
    pAVar12 = Allocator::DefaultAllocator();
    puVar13 = (undefined8 *)operator_new(0x48);
    *puVar13 = pAVar12;
    pDVar19 = (DataChunk *)(puVar13 + 7);
    puVar13[1] = pDVar19;
    puVar13[2] = 1;
    puVar13[3] = 0;
    puVar13[4] = 0;
    *(undefined4 *)(puVar13 + 5) = 0x3f800000;
    puVar13[6] = 0;
    puVar13[7] = 0;
    *(undefined4 *)(puVar13 + 8) = 0;
    *(undefined8 **)(l_state + 0x18) = puVar13;
  }
  local_50 = &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>;
  if (*(ulong *)(*(long *)(l_state + 0x18) + 0x20) >> 2 < *(ulong *)(l_state + 0x28)) {
    pvVar14 = vector<duckdb::FrameBounds,_true>::back((vector<duckdb::FrameBounds,_true> *)l_state);
    uVar20 = pvVar14->end;
    pvVar15 = vector<duckdb::FrameBounds,_true>::front(frames);
    if (pvVar15->start < uVar20) {
      pvVar15 = vector<duckdb::FrameBounds,_true>::back(frames);
      uVar20 = pvVar15->end;
      pvVar14 = vector<duckdb::FrameBounds,_true>::front
                          ((vector<duckdb::FrameBounds,_true> *)l_state);
      if (pvVar14->start < uVar20) {
        local_48.included =
             (ModeIncluded<duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>_> *)local_70;
        local_48.state = (ModeState<duckdb::string_t,_duckdb::ModeString> *)l_state;
        AggregateExecutor::
        IntersectFrames<duckdb::ModeFunction<duckdb::ModeString>::UpdateWindowState<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::string_t>>
                  ((SubFrames *)l_state,frames,&local_48);
        goto LAB_01ab57f3;
      }
    }
  }
  if (*(OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
        **)(l_state + 0x18) !=
      (OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
       *)0x0) {
    OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
    ::Destroy(*(OwningStringMap<duckdb::ModeAttr,_std::unordered_map<duckdb::string_t,_duckdb::ModeAttr,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>_>_>_>
                **)(l_state + 0x18));
  }
  l_state[0x28] = '\0';
  l_state[0x29] = '\0';
  l_state[0x2a] = '\0';
  l_state[0x2b] = '\0';
  l_state[0x2c] = '\0';
  l_state[0x2d] = '\0';
  l_state[0x2e] = '\0';
  l_state[0x2f] = '\0';
  l_state[0x38] = '\0';
  l_state[0x39] = '\0';
  l_state[0x3a] = '\0';
  l_state[0x3b] = '\0';
  l_state[0x3c] = '\0';
  l_state[0x3d] = '\0';
  l_state[0x3e] = '\0';
  l_state[0x3f] = '\0';
  l_state[0x30] = '\0';
  pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pFVar21 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                 super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                 _M_impl.super__Vector_impl_data._M_start; pFVar21 != pFVar4; pFVar21 = pFVar21 + 1)
  {
    for (seek_idx = pFVar21->start; uVar8 = local_70._8_8_, seek_idx < pFVar21->end;
        seek_idx = seek_idx + 1) {
      puVar5 = ((TemplatedValidityMask<unsigned_long> *)local_70._0_8_)->validity_mask;
      if ((puVar5 == (unsigned_long *)0x0) ||
         (pDVar19 = (DataChunk *)(seek_idx >> 6),
         (puVar5[(long)pDVar19] >> (seek_idx & 0x3f) & 1) != 0)) {
        state = *(ColumnDataScanState **)(local_70._8_8_ + 0x48);
        if ((state->next_row_index <= seek_idx) || (seek_idx < state->current_row_index)) {
          result_00 = (DataChunk *)(local_70._8_8_ + 0x50);
          pDVar19 = result_00;
          ColumnDataCollection::Seek
                    (*(ColumnDataCollection **)(local_70._8_8_ + 0x40),seek_idx,state,result_00);
          pvVar17 = vector<duckdb::Vector,_true>::operator[]
                              ((vector<duckdb::Vector,_true> *)result_00,0);
          *(data_ptr_t *)(uVar8 + 0x90) = pvVar17->data;
          pvVar17 = vector<duckdb::Vector,_true>::operator[]
                              ((vector<duckdb::Vector,_true> *)result_00,0);
          FlatVector::VerifyFlatVector(pvVar17);
          *(ValidityMask **)(uVar8 + 0x98) = &pvVar17->validity;
        }
        if ((**(long **)(uVar8 + 0x98) == 0) ||
           (uVar20 = seek_idx - *(long *)(*(long *)(uVar8 + 0x48) + 0x50),
           pDVar19 = (DataChunk *)(uVar20 >> 6 & 0x3ffffff),
           (*(ulong *)(**(long **)(uVar8 + 0x98) + (long)pDVar19 * 8) >> (uVar20 & 0x3f) & 1) != 0))
        {
          ModeState<duckdb::string_t,_duckdb::ModeString>::ModeAdd
                    ((ModeState<duckdb::string_t,_duckdb::ModeString> *)l_state,seek_idx);
        }
      }
    }
  }
LAB_01ab57f3:
  if (l_state[0x30] == '\0') {
    cVar16 = ModeState<duckdb::string_t,_duckdb::ModeString>::Scan
                       ((ModeState<duckdb::string_t,_duckdb::ModeString> *)l_state);
    if (cVar16.super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>.
        _M_cur != (__node_type *)0x0) {
      pDVar19 = *(DataChunk **)(l_state + 0x20);
      pVVar7 = *(pointer *)
                ((long)cVar16.
                       super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                       ._M_cur + 0x10);
      (pDVar19->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)
            ((long)cVar16.
                   super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                   ._M_cur + 8);
      (pDVar19->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish = pVVar7;
      lVar3 = *(long *)((long)cVar16.
                              super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                              ._M_cur + 0x18);
      *(long *)(l_state + 0x38) = lVar3;
      l_state[0x30] = lVar3 != 0;
    }
  }
  __x = local_50;
  pVVar9 = local_58;
  if (l_state[0x30] == '\x01') {
    sVar22.value.pointer.ptr = (char *)pDVar19;
    sVar22.value._0_8_ = (*(undefined8 **)(l_state + 0x20))[1];
    sVar22 = StringVector::AddStringOrBlob
                       ((StringVector *)local_58,(Vector *)**(undefined8 **)(l_state + 0x20),sVar22)
    ;
    *(long *)(local_60 + rid * 0x10) = sVar22.value._0_8_;
    *(long *)(local_60 + rid * 0x10 + 8) = sVar22.value._8_8_;
  }
  else {
    if ((local_58->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      local_38 = (local_58->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_48,&local_38);
      pMVar11 = local_48.included;
      pMVar10 = local_48.state;
      local_48.state = (ModeState<duckdb::string_t,_duckdb::ModeString> *)0x0;
      local_48.included =
           (ModeIncluded<duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>_> *)0x0;
      this = (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pMVar10;
      (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar11;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.included !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.included);
      }
      pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar18->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    bVar6 = (byte)rid & 0x3f;
    puVar1 = (pVVar9->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
             (rid >> 6);
    *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
  }
  ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
            ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,__x);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t rid) {
		auto &state = *reinterpret_cast<STATE *>(l_state);

		state.InitializePage(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);
		auto &prevs = state.prevs;
		if (prevs.empty()) {
			prevs.resize(1);
		}

		ModeIncluded<STATE> included(fmask, state);

		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(Allocator::DefaultAllocator());
		}
		const size_t tau_inverse = 4; // tau==0.25
		if (state.nonzero <= (state.frequency_map->size() / tau_inverse) || prevs.back().end <= frames.front().start ||
		    frames.back().end <= prevs.front().start) {
			state.Reset();
			// for f ∈ F do
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						state.ModeAdd(i);
					}
				}
			}
		} else {
			using Updater = UpdateWindowState<STATE, INPUT_TYPE>;
			Updater updater(state, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}

		if (!state.valid) {
			// Rescan
			auto highest_frequency = state.Scan();
			if (highest_frequency != state.frequency_map->end()) {
				*(state.mode) = highest_frequency->first;
				state.count = highest_frequency->second.count;
				state.valid = (state.count > 0);
			}
		}

		if (state.valid) {
			rdata[rid] = TYPE_OP::template Assign<INPUT_TYPE, RESULT_TYPE>(result, *state.mode);
		} else {
			rmask.Set(rid, false);
		}

		prevs = frames;
	}